

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrMultisamplePixelBufferAccess.cpp
# Opt level: O2

void rr::resolveMultisampleStencilBuffer
               (PixelBufferAccess *dst,MultisampleConstPixelBufferAccess *src)

{
  int stencil;
  int y;
  int z;
  int x;
  int y_00;
  PixelBufferAccess effectiveDst;
  ConstPixelBufferAccess effectiveSrc;
  ConstPixelBufferAccess local_78;
  ConstPixelBufferAccess local_50;
  
  tcu::getEffectiveDepthStencilAccess(&effectiveSrc,&src->m_access,MODE_STENCIL);
  tcu::getEffectiveDepthStencilAccess(&effectiveDst,dst,MODE_STENCIL);
  if ((src->m_access).m_size.m_data[0] == 1) {
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_78,&effectiveSrc);
    MultisampleConstPixelBufferAccess::toSinglesampleAccess
              (&local_50,(MultisampleConstPixelBufferAccess *)&local_78);
    tcu::copy((EVP_PKEY_CTX *)&effectiveDst,(EVP_PKEY_CTX *)&local_50);
  }
  else {
    for (z = 0; z < (dst->super_ConstPixelBufferAccess).m_size.m_data[1]; z = z + 1) {
      for (y_00 = 0; y_00 < (dst->super_ConstPixelBufferAccess).m_size.m_data[0]; y_00 = y_00 + 1) {
        stencil = tcu::ConstPixelBufferAccess::getPixStencil(&effectiveSrc,0,y_00,z);
        tcu::PixelBufferAccess::setPixStencil(&effectiveDst,stencil,y_00,z,0);
      }
    }
  }
  return;
}

Assistant:

void resolveMultisampleStencilBuffer (const tcu::PixelBufferAccess& dst, const MultisampleConstPixelBufferAccess& src)
{
	DE_ASSERT(dst.getWidth() == src.raw().getHeight());
	DE_ASSERT(dst.getHeight() == src.raw().getDepth());

	const tcu::ConstPixelBufferAccess	effectiveSrc = tcu::getEffectiveDepthStencilAccess(src.raw(), tcu::Sampler::MODE_STENCIL);
	const tcu::PixelBufferAccess		effectiveDst = tcu::getEffectiveDepthStencilAccess(dst, tcu::Sampler::MODE_STENCIL);

	if (src.getNumSamples() == 1)
	{
		// fast-path for non-multisampled cases
		tcu::copy(effectiveDst, MultisampleConstPixelBufferAccess::fromMultisampleAccess(effectiveSrc).toSinglesampleAccess());
	}
	else
	{
		// Resolve by selecting one
		for (int y = 0; y < dst.getHeight(); y++)
		for (int x = 0; x < dst.getWidth(); x++)
			effectiveDst.setPixStencil(effectiveSrc.getPixStencil(0, x, y), x, y);
	}
}